

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::Exception> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::Exception,wabt::interp::Store&,wabt::interp::Ref&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&>
          (RefPtr<wabt::interp::Exception> *__return_storage_ptr__,Store *this,Store *args,
          Ref *args_1,vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *args_2)

{
  Exception *pEVar1;
  Index index;
  Exception *local_40;
  Ref local_38;
  Ref ref;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *args_local_2;
  Ref *args_local_1;
  Store *args_local;
  Store *this_local;
  RefPtr<wabt::interp::Exception> *ptr;
  
  ref.index = (size_t)args_2;
  pEVar1 = (Exception *)operator_new(0x60);
  Exception::Exception(pEVar1,args,(Ref)args_1->index,(Values *)ref.index);
  local_40 = pEVar1;
  index = FreeList<wabt::interp::Object*>::New<wabt::interp::Exception*>
                    ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_40);
  Ref::Ref(&local_38,index);
  RefPtr<wabt::interp::Exception>::RefPtr(__return_storage_ptr__,this,local_38);
  pEVar1 = RefPtr<wabt::interp::Exception>::operator->(__return_storage_ptr__);
  (pEVar1->super_Object).self_.index = local_38.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}